

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::ArenaTest_ReflectionSwapFields_Test::TestBody
          (ArenaTest_ReflectionSwapFields_Test *this)

{
  TestAllTypes *pTVar1;
  TestAllTypes *pTVar2;
  Reflection *this_00;
  pointer *__ptr;
  char *pcVar3;
  AssertHelper local_518;
  AssertionResult gtest_ar_6;
  AssertHelper local_500;
  string output;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  TestAllTypes message;
  Arena arena1;
  Arena arena2;
  
  internal::ThreadSafeArena::ThreadSafeArena(&arena1.impl_);
  internal::ThreadSafeArena::ThreadSafeArena(&arena2.impl_);
  pTVar1 = (TestAllTypes *)Arena::DefaultConstruct<proto2_unittest::TestAllTypes>(&arena1);
  pTVar2 = (TestAllTypes *)Arena::DefaultConstruct<proto2_unittest::TestAllTypes>(&arena2);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(pTVar1);
  this_00 = proto2_unittest::TestAllTypes::GetReflection();
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Reflection::ListFields(this_00,(Message *)pTVar1,&fields);
  Reflection::SwapFields(this_00,(Message *)pTVar1,(Message *)pTVar2,&fields);
  gtest_ar_6._0_8_ = (pTVar1->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((gtest_ar_6._0_8_ & 1) != 0) {
    gtest_ar_6._0_8_ = *(ulong *)(gtest_ar_6._0_8_ & 0xfffffffffffffffe);
  }
  output._M_dataplus._M_p = (pointer)&arena1;
  testing::internal::CmpHelperEQ<google::protobuf::Arena*,google::protobuf::Arena*>
            ((internal *)&message,"&arena1","arena1_message->GetArena()",(Arena **)&output,
             (Arena **)&gtest_ar_6);
  if ((char)message.super_Message.super_MessageLite._vptr_MessageLite == '\0') {
    testing::Message::Message((Message *)&output);
    if (message.super_Message.super_MessageLite._internal_metadata_.ptr_ == 0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = *(char **)message.super_Message.super_MessageLite._internal_metadata_.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x2ce,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&output);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (output._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)output._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&message.super_Message.super_MessageLite._internal_metadata_);
  gtest_ar_6._0_8_ = (pTVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((gtest_ar_6._0_8_ & 1) != 0) {
    gtest_ar_6._0_8_ = *(ulong *)(gtest_ar_6._0_8_ & 0xfffffffffffffffe);
  }
  output._M_dataplus._M_p = (pointer)&arena2;
  testing::internal::CmpHelperEQ<google::protobuf::Arena*,google::protobuf::Arena*>
            ((internal *)&message,"&arena2","arena2_message->GetArena()",(Arena **)&output,
             (Arena **)&gtest_ar_6);
  if ((char)message.super_Message.super_MessageLite._vptr_MessageLite == '\0') {
    testing::Message::Message((Message *)&output);
    if (message.super_Message.super_MessageLite._internal_metadata_.ptr_ == 0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = *(char **)message.super_Message.super_MessageLite._internal_metadata_.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x2cf,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&output);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (output._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)output._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&message.super_Message.super_MessageLite._internal_metadata_);
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  output.field_2._M_local_buf[0] = '\0';
  MessageLite::SerializeToString((MessageLite *)pTVar1,&output);
  local_518.data_ = (AssertHelperData *)((ulong)local_518.data_._4_4_ << 0x20);
  gtest_ar_6._0_8_ = output._M_string_length;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&message,"0","output.size()",(int *)&local_518,(unsigned_long *)&gtest_ar_6
            );
  if ((char)message.super_Message.super_MessageLite._vptr_MessageLite == '\0') {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (message.super_Message.super_MessageLite._internal_metadata_.ptr_ == 0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = *(char **)message.super_Message.super_MessageLite._internal_metadata_.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_518,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x2d2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_518,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper(&local_518);
    if (gtest_ar_6._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_6._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&message.super_Message.super_MessageLite._internal_metadata_);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(pTVar2);
  Reflection::SwapFields(this_00,(Message *)pTVar1,(Message *)pTVar2,&fields);
  MessageLite::SerializeToString((MessageLite *)pTVar2,&output);
  local_518.data_ = local_518.data_ & 0xffffffff00000000;
  gtest_ar_6._0_8_ = output._M_string_length;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&message,"0","output.size()",(int *)&local_518,(unsigned_long *)&gtest_ar_6
            );
  if ((char)message.super_Message.super_MessageLite._vptr_MessageLite == '\0') {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (message.super_Message.super_MessageLite._internal_metadata_.ptr_ == 0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = *(char **)message.super_Message.super_MessageLite._internal_metadata_.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_518,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x2d6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_518,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper(&local_518);
    if (gtest_ar_6._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_6._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&message.super_Message.super_MessageLite._internal_metadata_);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(pTVar1);
  pTVar1 = (TestAllTypes *)Arena::DefaultConstruct<proto2_unittest::TestAllTypes>(&arena1);
  pTVar2 = (TestAllTypes *)Arena::DefaultConstruct<proto2_unittest::TestAllTypes>(&arena2);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(pTVar1);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(pTVar2);
  Reflection::SwapFields(this_00,(Message *)pTVar1,(Message *)pTVar2,&fields);
  local_518.data_ =
       (AssertHelperData *)(pTVar1->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)local_518.data_ & 1) != 0) {
    local_518.data_ = *(AssertHelperData **)((ulong)local_518.data_ & 0xfffffffffffffffe);
  }
  gtest_ar_6._0_8_ = &arena1;
  testing::internal::CmpHelperEQ<google::protobuf::Arena*,google::protobuf::Arena*>
            ((internal *)&message,"&arena1","arena1_message->GetArena()",(Arena **)&gtest_ar_6,
             (Arena **)&local_518);
  if ((char)message.super_Message.super_MessageLite._vptr_MessageLite == '\0') {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (message.super_Message.super_MessageLite._internal_metadata_.ptr_ == 0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = *(char **)message.super_Message.super_MessageLite._internal_metadata_.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_518,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x2df,pcVar3);
    testing::internal::AssertHelper::operator=(&local_518,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper(&local_518);
    if (gtest_ar_6._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_6._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&message.super_Message.super_MessageLite._internal_metadata_);
  local_518.data_ =
       (AssertHelperData *)(pTVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)local_518.data_ & 1) != 0) {
    local_518.data_ = *(AssertHelperData **)((ulong)local_518.data_ & 0xfffffffffffffffe);
  }
  gtest_ar_6._0_8_ = &arena2;
  testing::internal::CmpHelperEQ<google::protobuf::Arena*,google::protobuf::Arena*>
            ((internal *)&message,"&arena2","arena2_message->GetArena()",(Arena **)&gtest_ar_6,
             (Arena **)&local_518);
  if ((char)message.super_Message.super_MessageLite._vptr_MessageLite == '\0') {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (message.super_Message.super_MessageLite._internal_metadata_.ptr_ == 0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = *(char **)message.super_Message.super_MessageLite._internal_metadata_.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_518,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x2e0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_518,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper(&local_518);
    if (gtest_ar_6._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_6._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&message.super_Message.super_MessageLite._internal_metadata_);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(pTVar1);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(pTVar2);
  pTVar1 = (TestAllTypes *)Arena::DefaultConstruct<proto2_unittest::TestAllTypes>(&arena1);
  internal::ThreadSafeArena::ThreadSafeArena((ThreadSafeArena *)&message);
  pTVar2 = (TestAllTypes *)Arena::DefaultConstruct<proto2_unittest::TestAllTypes>((Arena *)&message)
  ;
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(pTVar2);
  Reflection::SwapFields(this_00,(Message *)pTVar1,(Message *)pTVar2,&fields);
  internal::ThreadSafeArena::~ThreadSafeArena((ThreadSafeArena *)&message);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(pTVar1);
  pTVar1 = (TestAllTypes *)Arena::DefaultConstruct<proto2_unittest::TestAllTypes>(&arena1);
  proto2_unittest::TestAllTypes::TestAllTypes(&message);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(pTVar1);
  Reflection::SwapFields(this_00,(Message *)pTVar1,&message.super_Message,&fields);
  local_500.data_ =
       (AssertHelperData *)(pTVar1->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)local_500.data_ & 1) != 0) {
    local_500.data_ = *(AssertHelperData **)((ulong)local_500.data_ & 0xfffffffffffffffe);
  }
  local_518.data_ = (AssertHelperData *)&arena1;
  testing::internal::CmpHelperEQ<google::protobuf::Arena*,google::protobuf::Arena*>
            ((internal *)&gtest_ar_6,"&arena1","arena1_message->GetArena()",(Arena **)&local_518,
             (Arena **)&local_500);
  if (gtest_ar_6.success_ == false) {
    testing::Message::Message((Message *)&local_518);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_6.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = *(char **)gtest_ar_6.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_500,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x2f3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_500,(Message *)&local_518);
    testing::internal::AssertHelper::~AssertHelper(&local_500);
    if (local_518.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_518.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_6.message_);
  if ((message.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    message.super_Message.super_MessageLite._internal_metadata_.ptr_ =
         *(undefined8 *)
          (message.super_Message.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffe);
  }
  testing::internal::EqHelper::Compare<google::protobuf::Arena>
            ((EqHelper *)&gtest_ar_6,"nullptr","message.GetArena()",(nullptr_t)0x0,
             (Arena *)message.super_Message.super_MessageLite._internal_metadata_.ptr_);
  if (gtest_ar_6.success_ == false) {
    testing::Message::Message((Message *)&local_518);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_6.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = *(char **)gtest_ar_6.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_500,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x2f4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_500,(Message *)&local_518);
    testing::internal::AssertHelper::~AssertHelper(&local_500);
    if (local_518.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_518.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_6.message_);
  MessageLite::SerializeToString((MessageLite *)pTVar1,&output);
  local_500.data_ = local_500.data_ & 0xffffffff00000000;
  local_518.data_ = (AssertHelperData *)output._M_string_length;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar_6,"0","output.size()",(int *)&local_500,
             (unsigned_long *)&local_518);
  if (gtest_ar_6.success_ == false) {
    testing::Message::Message((Message *)&local_518);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_6.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = *(char **)gtest_ar_6.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_500,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x2f6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_500,(Message *)&local_518);
    testing::internal::AssertHelper::~AssertHelper(&local_500);
    if (local_518.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_518.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_6.message_);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(&message);
  proto2_unittest::TestAllTypes::~TestAllTypes(&message);
  std::__cxx11::string::~string((string *)&output);
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 );
  internal::ThreadSafeArena::~ThreadSafeArena(&arena2.impl_);
  internal::ThreadSafeArena::~ThreadSafeArena(&arena1.impl_);
  return;
}

Assistant:

TEST(ArenaTest, ReflectionSwapFields) {
  Arena arena1;
  Arena arena2;
  TestAllTypes* arena1_message;
  TestAllTypes* arena2_message;

  // Case 1: messages on different arenas, only one message is set.
  arena1_message = Arena::Create<TestAllTypes>(&arena1);
  arena2_message = Arena::Create<TestAllTypes>(&arena2);
  TestUtil::SetAllFields(arena1_message);
  const Reflection* reflection = arena1_message->GetReflection();
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(*arena1_message, &fields);
  reflection->SwapFields(arena1_message, arena2_message, fields);
  EXPECT_EQ(&arena1, arena1_message->GetArena());
  EXPECT_EQ(&arena2, arena2_message->GetArena());
  std::string output;
  arena1_message->SerializeToString(&output);
  EXPECT_EQ(0, output.size());
  TestUtil::ExpectAllFieldsSet(*arena2_message);
  reflection->SwapFields(arena1_message, arena2_message, fields);
  arena2_message->SerializeToString(&output);
  EXPECT_EQ(0, output.size());
  TestUtil::ExpectAllFieldsSet(*arena1_message);

  // Case 2: messages on different arenas, both messages are set.
  arena1_message = Arena::Create<TestAllTypes>(&arena1);
  arena2_message = Arena::Create<TestAllTypes>(&arena2);
  TestUtil::SetAllFields(arena1_message);
  TestUtil::SetAllFields(arena2_message);
  reflection->SwapFields(arena1_message, arena2_message, fields);
  EXPECT_EQ(&arena1, arena1_message->GetArena());
  EXPECT_EQ(&arena2, arena2_message->GetArena());
  TestUtil::ExpectAllFieldsSet(*arena1_message);
  TestUtil::ExpectAllFieldsSet(*arena2_message);

  // Case 3: messages on different arenas with different lifetimes.
  arena1_message = Arena::Create<TestAllTypes>(&arena1);
  {
    Arena arena3;
    TestAllTypes* arena3_message = Arena::Create<TestAllTypes>(&arena3);
    TestUtil::SetAllFields(arena3_message);
    reflection->SwapFields(arena1_message, arena3_message, fields);
  }
  TestUtil::ExpectAllFieldsSet(*arena1_message);

  // Case 4: one message on arena, the other on heap.
  arena1_message = Arena::Create<TestAllTypes>(&arena1);
  TestAllTypes message;
  TestUtil::SetAllFields(arena1_message);
  reflection->SwapFields(arena1_message, &message, fields);
  EXPECT_EQ(&arena1, arena1_message->GetArena());
  EXPECT_EQ(nullptr, message.GetArena());
  arena1_message->SerializeToString(&output);
  EXPECT_EQ(0, output.size());
  TestUtil::ExpectAllFieldsSet(message);
}